

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_OptimizedTree.cpp
# Opt level: O2

void Opcode::AABBQuantizedTree::Walk(bool(*)(void_const*,void*),void*)::
     AABBQuantizedNode_const__bool_____void_const__void___void__
               (AABBQuantizedNode *current_node,GenericWalkingCallback callback,void *user_data)

{
  bool bVar1;
  
  while( true ) {
    if (current_node == (AABBQuantizedNode *)0x0) {
      return;
    }
    bVar1 = (*callback)(current_node,user_data);
    if (!bVar1) break;
    if (((ulong)current_node->mData & 1) != 0) {
      return;
    }
    AABBQuantizedNode_const__bool_____void_const__void___void__
              ((AABBQuantizedNode *)current_node->mData,callback,user_data);
    current_node = (AABBQuantizedNode *)(current_node->mData + 0x18);
  }
  return;
}

Assistant:

static void _Walk(const AABBQuantizedNode* current_node, GenericWalkingCallback callback, void* user_data)
		{
			if(!current_node || !(callback)(current_node, user_data))	return;

			if(!current_node->IsLeaf())
			{
				_Walk(current_node->GetPos(), callback, user_data);
				_Walk(current_node->GetNeg(), callback, user_data);
			}
		}